

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

LineInterpolationRange __thiscall
tcu::(anonymous_namespace)::
calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
          (_anonymous_namespace_ *this,Vec2 *pa,float wa,Vec2 *pb,float wb,IVec2 *pixel,
          int subpixelBits,
          _func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
          *weightEquation)

{
  int iVar1;
  int iVar2;
  float fVar3;
  Vec2 extraout_XMM0_Qa;
  LineInterpolationRange LVar5;
  float local_ec;
  Vector<float,_2> local_e8;
  Vector<float,_2> local_e0;
  undefined8 local_d8;
  Vec2 maxWeights;
  Vector<float,_2> local_c8;
  undefined8 local_c0;
  Vec2 minWeights;
  LineInterpolationRange weights [4];
  Vec2 corners [4];
  float testSquarePos;
  float testSquareSize;
  _func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
  *weightEquation_local;
  int subpixelBits_local;
  IVec2 *pixel_local;
  float wb_local;
  Vec2 *pb_local;
  float wa_local;
  Vec2 *pa_local;
  LineInterpolationRange *result;
  Vec2 VVar4;
  
  weightEquation_local._4_1_ = (byte)subpixelBits;
  local_ec = (float)(ulong)(1L << (weightEquation_local._4_1_ & 0x3f));
  local_ec = 2.0 / local_ec;
  fVar3 = 0.5 - local_ec / 2.0;
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(&weights[3].min,(float)iVar1 + fVar3 + 0.0,(float)iVar2 + fVar3 + 0.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(corners,(float)iVar1 + fVar3 + 0.0,(float)iVar2 + fVar3 + local_ec);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector
            (corners + 1,(float)iVar1 + fVar3 + local_ec,(float)iVar2 + fVar3 + local_ec);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(corners + 2,(float)iVar1 + fVar3 + local_ec,(float)iVar2 + fVar3 + 0.0);
  (*weightEquation)(&minWeights,wa,pa,wb,pb);
  (*weightEquation)(&weights[0].min,wa,pa,wb,pb);
  (*weightEquation)(&weights[1].min,wa,pa,wb,pb);
  LVar5 = (*weightEquation)(&weights[2].min,wa,pa,wb,pb);
  VVar4 = LVar5.min.m_data;
  min<float,2>((tcu *)&local_c8,&weights[0].max,&weights[1].max);
  min<float,2>((tcu *)&maxWeights,&weights[2].max,&weights[3].max);
  min<float,2>((tcu *)&local_c0,&local_c8,&maxWeights);
  max<float,2>((tcu *)&local_e0,&minWeights,&weights[0].min);
  max<float,2>((tcu *)&local_e8,&weights[1].min,&weights[2].min);
  max<float,2>((tcu *)&local_d8,&local_e0,&local_e8);
  anon_unknown_3::LineInterpolationRange::LineInterpolationRange((LineInterpolationRange *)this);
  *(undefined8 *)(this + 8) = local_c0;
  *(undefined8 *)this = local_d8;
  LVar5.min.m_data[0] = VVar4.m_data[0];
  LVar5.min.m_data[1] = VVar4.m_data[1];
  LVar5.max.m_data[0] = extraout_XMM0_Qa.m_data[0];
  LVar5.max.m_data[1] = extraout_XMM0_Qa.m_data[1];
  return LVar5;
}

Assistant:

LineInterpolationRange calcSingleSampleLineInterpolationRangeWithWeightEquation (const tcu::Vec2&	pa,
																				 float				wa,
																				 const tcu::Vec2&	pb,
																				 float				wb,
																				 const tcu::IVec2&	pixel,
																				 int				subpixelBits,
																				 WeightEquation		weightEquation)
{
	// allow interpolation weights anywhere in the central subpixels
	const float testSquareSize = (2.0f / (float)(1UL << subpixelBits));
	const float testSquarePos  = (0.5f - testSquareSize / 2);

	const tcu::Vec2 corners[4] =
	{
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + 0.0f),
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + 0.0f),
	};

	// calculate interpolation as a line
	const LineInterpolationRange weights[4] =
	{
		weightEquation(pa, wa, pb, wb, corners[0]),
		weightEquation(pa, wa, pb, wb, corners[1]),
		weightEquation(pa, wa, pb, wb, corners[2]),
		weightEquation(pa, wa, pb, wb, corners[3]),
	};

	const tcu::Vec2 minWeights = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
	const tcu::Vec2 maxWeights = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));

	LineInterpolationRange result;
	result.min = minWeights;
	result.max = maxWeights;
	return result;
}